

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# languageService.cpp
# Opt level: O0

void lsp::LanguageService::toClient_request_workspace_configuration(void)

{
  allocator<lsp::types::ConfigurationItem> *this;
  initializer_list<lsp::types::ConfigurationItem> __l;
  uint32_t uVar1;
  element_type *this_00;
  element_type *this_01;
  ConfigurationItem *local_260;
  response_callback local_238;
  undefined1 local_218 [144];
  string local_188;
  undefined1 local_168 [8];
  Request request;
  Id id;
  allocator<char> local_69;
  string *local_68;
  ConfigurationItem local_60;
  iterator local_40;
  size_type local_38;
  ConfigurationParams local_30;
  undefined1 local_18 [8];
  json paramsjson;
  
  id.string_id_.field_2._M_local_buf[0xb] = '\x01';
  local_68 = (string *)&local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"arxmlNavigationHelper",&local_69);
  id.string_id_.field_2._M_local_buf[0xb] = '\0';
  local_40 = &local_60;
  local_38 = 1;
  this = (allocator<lsp::types::ConfigurationItem> *)(id.string_id_.field_2._M_local_buf + 10);
  std::allocator<lsp::types::ConfigurationItem>::allocator(this);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<lsp::types::ConfigurationItem,_std::allocator<lsp::types::ConfigurationItem>_>::vector
            (&local_30.items,__l,this);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json<lsp::types::ConfigurationParams,_lsp::types::ConfigurationParams,_0>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)local_18,&local_30);
  types::ConfigurationParams::~ConfigurationParams(&local_30);
  std::allocator<lsp::types::ConfigurationItem>::~allocator
            ((allocator<lsp::types::ConfigurationItem> *)(id.string_id_.field_2._M_local_buf + 10));
  local_260 = (ConfigurationItem *)&local_40;
  do {
    local_260 = local_260 + -1;
    types::ConfigurationItem::~ConfigurationItem(local_260);
  } while (local_260 != &local_60);
  std::allocator<char>::~allocator(&local_69);
  uVar1 = getNextRequestID();
  jsonrpcpp::Id::Id((Id *)((long)&request.id_.string_id_.field_2 + 8),uVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_188,"workspace/configuration",(allocator<char> *)(local_218 + 0x8f));
  jsonrpcpp::Parameter::Parameter((Parameter *)(local_218 + 0x30),(Json *)local_18);
  jsonrpcpp::Request::Request
            ((Request *)local_168,(Id *)((long)&request.id_.string_id_.field_2 + 8),&local_188,
             (Parameter *)(local_218 + 0x30));
  jsonrpcpp::Parameter::~Parameter((Parameter *)(local_218 + 0x30));
  std::__cxx11::string::~string((string *)&local_188);
  std::allocator<char>::~allocator((allocator<char> *)(local_218 + 0x8f));
  this_00 = std::__shared_ptr_access<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<lsp::IOHandler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&ioHandler_);
  jsonrpcpp::Request::to_json_abi_cxx11_((Request *)local_218);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::dump((string_t *)(local_218 + 0x10),
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *)local_218,-1,' ',false,strict);
  IOHandler::addMessageToSend(this_00,(string *)(local_218 + 0x10));
  std::__cxx11::string::~string((string *)(local_218 + 0x10));
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_218);
  this_01 = std::__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<lsp::MessageParser,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&messageParser_);
  uVar1 = jsonrpcpp::Id::int_id((Id *)((long)&request.id_.string_id_.field_2 + 8));
  std::
  function<void(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)>
  ::
  function<void(&)(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&),void>
            ((function<void(nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>const&)>
              *)&local_238,response_workspace_configuration);
  MessageParser::register_response_callback(this_01,uVar1,&local_238);
  std::
  function<void_(const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&)>
  ::~function(&local_238);
  jsonrpcpp::Request::~Request((Request *)local_168);
  jsonrpcpp::Id::~Id((Id *)((long)&request.id_.string_id_.field_2 + 8));
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_18);
  return;
}

Assistant:

void lsp::LanguageService::toClient_request_workspace_configuration()
{
    json paramsjson = lsp::types::ConfigurationParams{std::vector<lsp::types::ConfigurationItem>{{"arxmlNavigationHelper"}}};
    jsonrpcpp::Id id(getNextRequestID());
    jsonrpcpp::Request request(id, "workspace/configuration", paramsjson);
    ioHandler_->addMessageToSend(request.to_json().dump());
    messageParser_->register_response_callback(id.int_id(), response_workspace_configuration);
}